

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.h
# Opt level: O1

int exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
              (long seed,long pdf_first,long pdf_last,int *chosen_index)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar5 = *(ulong *)(pdf_first + 8);
  iVar2 = 1;
  if (uVar5 < *(ulong *)(pdf_last + 8)) {
    fVar6 = 0.0;
    if (uVar5 != *(ulong *)(pdf_last + 8)) {
      do {
        if (*(float *)(uVar5 + 4) <= 0.0 && *(float *)(uVar5 + 4) != 0.0) {
          *(undefined4 *)(uVar5 + 4) = 0;
        }
        fVar6 = fVar6 + *(float *)(uVar5 + 4);
        uVar5 = uVar5 + 8;
      } while (uVar5 != *(ulong *)(pdf_last + 8));
    }
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      *chosen_index = 0;
      *(undefined4 *)(*(long *)(pdf_first + 8) + 4) = 0x3f800000;
      return 0;
    }
    lVar3 = *(long *)(pdf_first + 8);
    iVar2 = 0;
    if (lVar3 == *(long *)(pdf_last + 8)) {
      iVar4 = -1;
      bVar1 = false;
    }
    else {
      fVar8 = ((float)((uint)(seed * 0x66d5deece66d + 0x7fffffffU >> 0x19) & 0x7fffff | 0x3f800000)
              + -1.0) * fVar6;
      fVar7 = fVar6;
      if (fVar8 <= fVar6) {
        fVar7 = fVar8;
      }
      fVar8 = 0.0;
      iVar4 = -1;
      bVar1 = false;
      do {
        iVar4 = iVar4 + 1;
        fVar8 = fVar8 + *(float *)(lVar3 + 4);
        if ((!bVar1) && (fVar7 < fVar8)) {
          *chosen_index = iVar4;
          bVar1 = true;
        }
        *(float *)(lVar3 + 4) = *(float *)(lVar3 + 4) / fVar6;
        lVar3 = lVar3 + 8;
      } while (lVar3 != *(long *)(pdf_last + 8));
    }
    if (!bVar1) {
      *chosen_index = iVar4;
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

bool operator!=(const score_iterator& other) const { return _p != other._p; }